

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondGeometric.cpp
# Opt level: O0

void __thiscall OpenMD::HBondGeometric::writeHistogram(HBondGeometric *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  undefined8 uVar5;
  StaticAnalyser *in_RDI;
  int i;
  ofstream osq;
  char *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  string local_238 [32];
  int local_218;
  ostream local_208 [520];
  
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    uVar5 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"HBondGeometric: unable to open %s\n",uVar5);
    std::__cxx11::string::~string(local_238);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<(local_208,"# HydrogenBonding Statistics\n");
    poVar3 = std::operator<<(local_208,"# selection1: (");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI[1].info_);
    poVar3 = std::operator<<(poVar3,")");
    poVar3 = std::operator<<(poVar3,"\tselection2: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 9));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"# molecules in selection1: ");
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,(int)in_RDI[0x11].analysisType_._M_string_length);
    std::operator<<(poVar3,"\n");
    std::operator<<(local_208,"# nHBonds\tnAcceptor\tnDonor\tp(nHBonds)\tp(nAcceptor)\tp(nDonor)\n")
    ;
    for (local_218 = 0; local_218 < *(int *)&in_RDI[0x11].dumpFilename_.field_0x4;
        local_218 = local_218 + 1) {
      std::ostream::operator<<(local_208,local_218);
      poVar3 = std::operator<<(local_208,"\t");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x11].dumpFilename_._M_string_length,(long)local_218);
      std::ostream::operator<<(poVar3,*pvVar4);
      poVar3 = std::operator<<(local_208,"\t");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[0x11].outputFilename_.field_2
                          ,(long)local_218);
      std::ostream::operator<<(poVar3,*pvVar4);
      poVar3 = std::operator<<(local_208,"\t");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[0x11].step_,(long)local_218);
      std::ostream::operator<<(poVar3,*pvVar4);
      poVar3 = std::operator<<(local_208,"\t");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x11].dumpFilename_._M_string_length,(long)local_218);
      std::ostream::operator<<
                (poVar3,(double)*pvVar4 / (double)(int)in_RDI[0x11].analysisType_._M_string_length);
      poVar3 = std::operator<<(local_208,"\t");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[0x11].outputFilename_.field_2
                          ,(long)local_218);
      std::ostream::operator<<
                (poVar3,(double)*pvVar4 / (double)(int)in_RDI[0x11].analysisType_._M_string_length);
      poVar3 = std::operator<<(local_208,"\t");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[0x11].step_,(long)local_218);
      std::ostream::operator<<
                (poVar3,(double)*pvVar4 / (double)(int)in_RDI[0x11].analysisType_._M_string_length);
      std::operator<<(local_208,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void HBondGeometric::writeHistogram() {
    std::ofstream osq(getOutputFileName().c_str());

    if (osq.is_open()) {
      osq << "# HydrogenBonding Statistics\n";
      osq << "# selection1: (" << selectionScript1_ << ")"
          << "\tselection2: (" << selectionScript2_ << ")\n";
      osq << "# molecules in selection1: " << nSelected_ << "\n";
      osq << "# "
             "nHBonds\tnAcceptor\tnDonor\tp(nHBonds)\tp(nAcceptor)\tp(nDonor)"
             "\n";
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        osq << i;
        osq << "\t" << nHBonds_[i];
        osq << "\t" << nAcceptor_[i];
        osq << "\t" << nDonor_[i];
        osq << "\t" << (RealType)(nHBonds_[i]) / nSelected_;
        osq << "\t" << (RealType)(nAcceptor_[i]) / nSelected_;
        osq << "\t" << (RealType)(nDonor_[i]) / nSelected_;
        osq << "\n";
      }
      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondGeometric: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }